

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O2

void baryonyx::itm::
     random_shuffle_unique<baryonyx::itm::solver_random_inequalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>>::rc_data*>
               (rc_data *begin,rc_data *end,random_engine *rng)

{
  rc_data *__first;
  
  __first = begin;
  while (begin = begin + 1, begin != end) {
    if ((__first->value != begin->value) || (NAN(__first->value) || NAN(begin->value))) {
      std::
      shuffle<baryonyx::itm::solver_random_inequalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                (__first,begin,rng);
      __first = begin;
    }
  }
  std::
  shuffle<baryonyx::itm::solver_random_inequalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
            (__first,begin,rng);
  return;
}

Assistant:

inline void
random_shuffle_unique(iteratorT begin,
                      iteratorT end,
                      random_engine& rng) noexcept
{
    auto ret = begin++;
    for (; begin != end; ++begin) {
        if (ret->value != begin->value) {
            std::shuffle(ret, begin, rng);
            ret = begin;
        }
    }

    std::shuffle(ret, begin, rng);
}